

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.cpp
# Opt level: O3

vector<AST_*,_std::allocator<AST_*>_> * __thiscall
AST::find(vector<AST_*,_std::allocator<AST_*>_> *__return_storage_ptr__,AST *this,string *varName)

{
  ASTree *pAVar1;
  pointer pcVar2;
  pointer ppAVar3;
  vector<ASTree_*,_std::allocator<ASTree_*>_> *__range1;
  pointer ppAVar4;
  vector<ASTree_*,_std::allocator<ASTree_*>_> trees1;
  vector<ASTree_*,_std::allocator<ASTree_*>_> local_68;
  AST *local_50;
  string local_48;
  
  local_68.super__Vector_base<ASTree_*,_std::allocator<ASTree_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_68.super__Vector_base<ASTree_*,_std::allocator<ASTree_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_68.super__Vector_base<ASTree_*,_std::allocator<ASTree_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<AST_*,_std::allocator<AST_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<AST_*,_std::allocator<AST_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<AST_*,_std::allocator<AST_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pAVar1 = this->ast;
  pcVar2 = (varName->_M_dataplus)._M_p;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar2,pcVar2 + varName->_M_string_length);
  ASTree::find(pAVar1,&local_48,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  ppAVar3 = local_68.super__Vector_base<ASTree_*,_std::allocator<ASTree_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (local_68.super__Vector_base<ASTree_*,_std::allocator<ASTree_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_68.super__Vector_base<ASTree_*,_std::allocator<ASTree_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    ppAVar4 = local_68.super__Vector_base<ASTree_*,_std::allocator<ASTree_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      pAVar1 = *ppAVar4;
      local_50 = (AST *)operator_new(8);
      local_50->ast = pAVar1;
      std::vector<AST*,std::allocator<AST*>>::emplace_back<AST*>
                ((vector<AST*,std::allocator<AST*>> *)__return_storage_ptr__,&local_50);
      ppAVar4 = ppAVar4 + 1;
    } while (ppAVar4 != ppAVar3);
  }
  if (local_68.super__Vector_base<ASTree_*,_std::allocator<ASTree_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<ASTree_*,_std::allocator<ASTree_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<ASTree_*,_std::allocator<ASTree_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<ASTree_*,_std::allocator<ASTree_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<AST *> AST::find(std::string varName) {
    std::vector<ASTree *> trees1;
    std::vector<AST *> trees2;
    ast->find(varName, trees1);
    for (auto tree: trees1) {
        trees2.emplace_back(new AST(tree));
    }
    return trees2;
}